

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PositionError.h
# Opt level: O0

PositionError * __thiscall
KDIS::DATA_TYPE::PositionError::operator=(PositionError *this,PositionError *param_1)

{
  KFIXED<short,_(unsigned_char)__b_> local_68;
  KFIXED<short,_(unsigned_char)__b_> local_58 [2];
  KFIXED<short,_(unsigned_char)__b_> local_38;
  KFIXED<short,_(unsigned_char)__b_> local_28;
  PositionError *local_18;
  PositionError *param_1_local;
  PositionError *this_local;
  
  local_18 = param_1;
  param_1_local = this;
  DataTypeBase::operator=(&this->super_DataTypeBase,&param_1->super_DataTypeBase);
  KFIXED<short,_(unsigned_char)'\b'>::KFIXED(&local_38,&local_18->m_HorzErr);
  KFIXED<short,_(unsigned_char)'\b'>::operator=(&local_28,&this->m_HorzErr);
  KFIXED<short,_(unsigned_char)'\b'>::~KFIXED(&local_28);
  KFIXED<short,_(unsigned_char)'\b'>::~KFIXED(&local_38);
  KFIXED<short,_(unsigned_char)'\b'>::KFIXED(&local_68,&local_18->m_VertErr);
  KFIXED<short,_(unsigned_char)'\b'>::operator=(local_58,&this->m_VertErr);
  KFIXED<short,_(unsigned_char)'\b'>::~KFIXED(local_58);
  KFIXED<short,_(unsigned_char)'\b'>::~KFIXED(&local_68);
  return this;
}

Assistant:

class KDIS_EXPORT PositionError : public DataTypeBase
{
protected:

    KFIXED16_8 m_HorzErr;

    KFIXED16_8 m_VertErr;

public:

    static const KUINT16 POSITION_ERROR_SIZE = 4;

    PositionError();

    PositionError( KFIXED16_8 Horizontal, KFIXED16_8 Vertical );

    PositionError(KDataStream &stream) noexcept(false);

    virtual ~PositionError();

    //************************************
    // FullName:    KDIS::DATA_TYPE::PositionError::SetHorizontalError
    //              KDIS::DATA_TYPE::PositionError::GetHorizontalError
    // Description: The error components that are associated with the
    //              location measurement  for an entity. These errors
    //              are measured in entity-centered tangent planes.
    // Parameter:   KFIXED16_8 HE
    //************************************
    void SetHorizontalError( KFIXED16_8 HE );
    KFIXED16_8 GetHorizontalError() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::PositionError::SetVerticalError
    //              KDIS::DATA_TYPE::PositionError::GetVerticalError
    // Description: The error components that are associated with the
    //              location measurement  for an entity. These errors
    //              are measured in entity-centered tangent planes.
    // Parameter:   KFIXED16_8 VE
    //************************************
    void SetVerticalError( KFIXED16_8 VE );
    KFIXED16_8 GetVerticalError() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::PositionError::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::DataTypeBase::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::PositionError::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const PositionError & Value ) const;
    KBOOL operator != ( const PositionError & Value ) const;
}